

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::ExtensionRangeOptions::_InternalSerialize
          (ExtensionRangeOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  FeatureSet *value;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ExtensionRangeOptions_VerificationState value_00;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_00;
  const_reference this_01;
  uint32_t *puVar4;
  uint8_t *target_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_02;
  const_reference this_03;
  ExtensionRangeOptions *extendee;
  UnknownFieldSet *unknown_fields;
  UninterpretedOption *repfield_1;
  uint n_1;
  uint i_1;
  ExtensionRangeOptions_Declaration *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  ExtensionRangeOptions *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ExtensionRangeOptions *this_local;
  
  local_30 = 0;
  uVar2 = _internal_declaration_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    this_00 = _internal_declaration(this);
    this_01 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::Get
                        (this_00,local_30);
    iVar3 = ExtensionRangeOptions_Declaration::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,stream);
  }
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar2 = *puVar4;
  if ((uVar2 & 2) != 0) {
    target_00 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_verification(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(3,value_00,target_00);
  }
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    iVar3 = FeatureSet::GetCachedSize((this->field_0)._impl_.features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x32,(MessageLite *)value,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_1._4_4_ = 0;
  uVar2 = _internal_uninterpreted_option_size(this);
  for (; repfield_1._4_4_ < uVar2; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_02 = _internal_uninterpreted_option(this);
    this_03 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Get(this_02,repfield_1._4_4_)
    ;
    iVar3 = UninterpretedOption::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (999,(MessageLite *)this_03,iVar3,(uint8_t *)stream_local,stream);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ExtensionRangeOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ExtensionRangeOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ExtensionRangeOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.ExtensionRangeOptions.Declaration declaration = 2 [retention = RETENTION_SOURCE];
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_declaration_size());
       i < n; i++) {
    const auto& repfield = this_._internal_declaration().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.ExtensionRangeOptions.VerificationState verification = 3 [default = UNVERIFIED, retention = RETENTION_SOURCE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_verification(), target);
  }

  // optional .google.protobuf.FeatureSet features = 50;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        50, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ExtensionRangeOptions)
  return target;
}